

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_queue.c
# Opt level: O0

uo_cb * uo_cb_queue_try_dequeue(void)

{
  uo_cb *puVar1;
  int iVar2;
  uo_cb *cb;
  size_t tail;
  timespec abs_timeout;
  
  clock_gettime(0,(timespec *)&tail);
  timespec_add_ms((timespec *)&tail,500.0);
  iVar2 = sem_timedwait((sem_t *)&cb_queue,(timespec *)&tail);
  if (iVar2 == 0) {
    LOCK();
    UNLOCK();
    puVar1 = cb_queue.cbs[cb_queue.tail & 0xff];
    cb_queue.tail = cb_queue.tail + 1;
    sem_post((sem_t *)&cb_queue.enqueue_sem);
    abs_timeout.tv_nsec = (__syscall_slong_t)puVar1;
  }
  else {
    abs_timeout.tv_nsec = 0;
  }
  return (uo_cb *)abs_timeout.tv_nsec;
}

Assistant:

uo_cb *uo_cb_queue_try_dequeue()
{
    struct timespec abs_timeout;
    clock_gettime(CLOCK_REALTIME, &abs_timeout);
    timespec_add_ms(&abs_timeout, UO_CB_QUEUE_SEM_TIMEO);

    if (sem_timedwait(&cb_queue.dequeue_sem, &abs_timeout) == 0)
    {
        size_t tail = atomic_fetch_add(&cb_queue.tail, 1);
        uo_cb *cb = cb_queue.cbs[tail % UO_CB_QUEUE_CAPACITY];

        sem_post(&cb_queue.enqueue_sem);

        return cb;
    }
    
    return NULL;
}